

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O3

void __thiscall
duckdb::DatabaseManager::ResetDatabases
          (DatabaseManager *this,
          unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true>
          *scheduler)

{
  undefined8 *puVar1;
  pointer this_00;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *__range1;
  reference_wrapper<duckdb::AttachedDatabase> *database;
  undefined8 *puVar2;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> result;
  undefined8 *local_58;
  undefined8 *puStack_50;
  undefined8 local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_58 = (undefined8 *)0x0;
  puStack_50 = (undefined8 *)0x0;
  local_48 = 0;
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->(&this->databases);
  local_40._8_8_ = 0;
  local_28 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/main/database_manager.cpp:227:18)>
             ::_M_invoke;
  local_30 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/main/database_manager.cpp:227:18)>
             ::_M_manager;
  local_40._M_unused._M_object = &local_58;
  CatalogSet::Scan(this_00,(function<void_(duckdb::CatalogEntry_&)> *)&local_40);
  puVar2 = local_58;
  puVar1 = puStack_50;
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
    puVar2 = local_58;
    puVar1 = puStack_50;
  }
  for (; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    AttachedDatabase::Close((AttachedDatabase *)*puVar2);
  }
  ::std::__uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_>::reset
            ((__uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_> *)
             scheduler,(pointer)0x0);
  ::std::__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::reset
            ((__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_> *)
             &this->databases,(pointer)0x0);
  if (local_58 != (undefined8 *)0x0) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void DatabaseManager::ResetDatabases(unique_ptr<TaskScheduler> &scheduler) {
	vector<reference<AttachedDatabase>> result;
	databases->Scan([&](CatalogEntry &entry) { result.push_back(entry.Cast<AttachedDatabase>()); });
	for (auto &database : result) {
		database.get().Close();
	}
	scheduler.reset();
	databases.reset();
}